

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

void print_set_debug(lyxp_set *set)

{
  longdouble lVar1;
  uint uVar2;
  uint uVar3;
  lyxp_set_node *plVar4;
  long *plVar5;
  long *plVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  char *format;
  char *pcVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  long local_68;
  ushort uStack_60;
  char *local_40;
  char *str_num;
  
  if (ly_log_level < 3) {
    return;
  }
  switch(set->type) {
  case LYXP_SET_EMPTY:
    ly_log_dbg(8,"set EMPTY");
    return;
  case LYXP_SET_NODE_SET:
    ly_log_dbg(8,"set NODE SET:");
    if (set->used != 0) {
      lVar14 = 0xc;
      uVar13 = 0;
      do {
        plVar4 = (set->val).nodes;
        iVar7 = (int)uVar13;
        switch(*(undefined4 *)((long)plVar4 + lVar14 + -4)) {
        case 0:
          uVar2 = *(uint *)((long)&plVar4->node + lVar14);
          pcVar10 = "\t%d (pos %u): ROOT";
          goto LAB_0017b985;
        case 1:
          uVar2 = *(uint *)((long)&plVar4->node + lVar14);
          pcVar10 = "\t%d (pos %u): ROOT CONFIG";
LAB_0017b985:
          ly_log_dbg(8,pcVar10,(ulong)(iVar7 + 1),(ulong)uVar2);
          break;
        case 2:
          plVar6 = *(long **)((long)plVar4 + lVar14 + -0xc);
          plVar5 = (long *)*plVar6;
          if ((int)plVar5[7] == 8) {
            uVar8 = (ulong)*(uint *)((long)&plVar4->node + lVar14);
            lVar11 = *plVar5;
            lVar12 = plVar6[7];
            uVar9 = (ulong)(iVar7 + 1);
            pcVar10 = "\t%d (pos %u): ELEM %s (val: %s)";
          }
          else {
            if (((int)plVar5[7] != 0x10) || (*(int *)(*(long *)plVar6[8] + 0x38) != 4)) {
              uVar3 = *(uint *)((long)&plVar4->node + lVar14);
              pcVar10 = (char *)*plVar5;
              uVar8 = (ulong)(iVar7 + 1);
              format = "\t%d (pos %u): ELEM %s";
              goto LAB_0017b9e0;
            }
            uVar8 = (ulong)*(uint *)((long)&plVar4->node + lVar14);
            lVar11 = *plVar5;
            lVar12 = ((long *)plVar6[8])[7];
            uVar9 = (ulong)(iVar7 + 1);
            pcVar10 = "\t%d (pos %u): ELEM %s (1st child val: %s)";
          }
          goto LAB_0017b9c0;
        case 3:
          plVar6 = *(long **)((long)plVar4 + lVar14 + -0xc);
          uVar2 = *(uint *)(*plVar6 + 0x38);
          uVar8 = uVar13 + 1;
          uVar3 = *(uint *)((long)&plVar4->node + lVar14);
          if ((uVar2 & 0x8020) == 0) {
            pcVar10 = (char *)plVar6[7];
            format = "\t%d (pos %u): TEXT %s";
          }
          else {
            pcVar10 = "anydata";
            if (uVar2 == 0x20) {
              pcVar10 = "anyxml";
            }
            format = "\t%d (pos %u): TEXT <%s>";
          }
LAB_0017b9e0:
          ly_log_dbg(8,format,uVar8,(ulong)uVar3,pcVar10);
          break;
        case 4:
          uVar8 = (ulong)*(uint *)((long)&plVar4->node + lVar14);
          lVar12 = *(long *)((long)plVar4 + lVar14 + -0xc);
          lVar11 = *(long *)(lVar12 + 0x18);
          lVar12 = *(long *)(lVar12 + 0x28);
          uVar9 = (ulong)(iVar7 + 1);
          pcVar10 = "\t%d (pos %u): ATTR %s = %s";
LAB_0017b9c0:
          ly_log_dbg(8,pcVar10,uVar9,uVar8,lVar11,lVar12);
        }
        uVar13 = uVar13 + 1;
        lVar14 = lVar14 + 0x10;
      } while (uVar13 < set->used);
    }
    break;
  case LYXP_SET_SNODE_SET:
    ly_log_dbg(8,"set SNODE SET:");
    if (set->used != 0) {
      lVar14 = 0xc;
      uVar13 = 0;
      do {
        plVar4 = (set->val).nodes;
        iVar7 = *(int *)((long)plVar4 + lVar14 + -4);
        if (iVar7 == 2) {
          ly_log_dbg(8,"\t%d (%u): ELEM %s",(ulong)((int)uVar13 + 1),
                     (ulong)*(uint *)((long)&plVar4->node + lVar14),
                     **(undefined8 **)((long)plVar4 + lVar14 + -0xc));
        }
        else {
          if (iVar7 == 1) {
            uVar2 = *(uint *)((long)&plVar4->node + lVar14);
            pcVar10 = "\t%d (%u): ROOT CONFIG";
          }
          else {
            if (iVar7 != 0) {
              ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                     ,0x107);
              goto LAB_0017b813;
            }
            uVar2 = *(uint *)((long)&plVar4->node + lVar14);
            pcVar10 = "\t%d (%u): ROOT";
          }
          ly_log_dbg(8,pcVar10,(ulong)((int)uVar13 + 1),(ulong)uVar2);
        }
LAB_0017b813:
        uVar13 = uVar13 + 1;
        lVar14 = lVar14 + 0x10;
      } while (uVar13 < set->used);
    }
    break;
  case LYXP_SET_BOOLEAN:
    ly_log_dbg(8,"set BOOLEAN");
    pcVar10 = "true";
    if ((set->val).bool == 0) {
      pcVar10 = "false";
    }
    goto LAB_0017ba16;
  case LYXP_SET_NUMBER:
    ly_log_dbg(8,"set NUMBER");
    lVar1 = (set->val).num;
    if (NAN(lVar1)) {
      pcVar10 = "NaN";
LAB_0017baa6:
      local_40 = strdup(pcVar10);
    }
    else {
      if ((lVar1 == (longdouble)0) && (!NAN(lVar1) && !NAN((longdouble)0))) {
        pcVar10 = "0";
        goto LAB_0017baa6;
      }
      local_68 = SUB108(lVar1,0);
      uStack_60 = (ushort)((unkuint10)lVar1 >> 0x40);
      if (-1 < (short)uStack_60 && ((~uStack_60 & 0x7fff) == 0 && local_68 == -0x8000000000000000))
      {
        pcVar10 = "Infinity";
        goto LAB_0017baa6;
      }
      if (((~uStack_60 & 0x7fff) == 0 && local_68 == -0x8000000000000000) && (short)uStack_60 < 0) {
        pcVar10 = "-Infinity";
        goto LAB_0017baa6;
      }
      if ((lVar1 != (longdouble)(long)ROUND(lVar1)) ||
         (NAN(lVar1) || NAN((longdouble)(long)ROUND(lVar1)))) {
        iVar7 = asprintf(&local_40,"%03.1Lf");
      }
      else {
        iVar7 = asprintf(&local_40,"%lld");
      }
      if (iVar7 == -1) {
        local_40 = (char *)0x0;
      }
    }
    if (local_40 == (char *)0x0) {
      ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","print_set_debug");
    }
    else {
      ly_log_dbg(8,"\t%s");
      free(local_40);
    }
    break;
  case LYXP_SET_STRING:
    ly_log_dbg(8,"set STRING");
    pcVar10 = (char *)(set->val).nodes;
LAB_0017ba16:
    ly_log_dbg(8,"\t%s",pcVar10);
    return;
  }
  return;
}

Assistant:

static void
print_set_debug(struct lyxp_set *set)
{
    uint32_t i;
    char *str_num;
    struct lyxp_set_node *item;
    struct lyxp_set_snode *sitem;

    if (ly_log_level < LY_LLDBG) {
        return;
    }

    switch (set->type) {
    case LYXP_SET_NODE_SET:
        LOGDBG(LY_LDGXPATH, "set NODE SET:");
        for (i = 0; i < set->used; ++i) {
            item = &set->val.nodes[i];

            switch (item->type) {
            case LYXP_NODE_ROOT:
                LOGDBG(LY_LDGXPATH, "\t%d (pos %u): ROOT", i + 1, item->pos);
                break;
            case LYXP_NODE_ROOT_CONFIG:
                LOGDBG(LY_LDGXPATH, "\t%d (pos %u): ROOT CONFIG", i + 1, item->pos);
                break;
            case LYXP_NODE_ELEM:
                if ((item->node->schema->nodetype == LYS_LIST)
                        && (item->node->child->schema->nodetype == LYS_LEAF)) {
                    LOGDBG(LY_LDGXPATH, "\t%d (pos %u): ELEM %s (1st child val: %s)", i + 1, item->pos,
                           item->node->schema->name,
                           ((struct lyd_node_leaf_list *)item->node->child)->value_str);
                } else if (item->node->schema->nodetype == LYS_LEAFLIST) {
                    LOGDBG(LY_LDGXPATH, "\t%d (pos %u): ELEM %s (val: %s)", i + 1, item->pos,
                           item->node->schema->name,
                           ((struct lyd_node_leaf_list *)item->node)->value_str);
                } else {
                    LOGDBG(LY_LDGXPATH, "\t%d (pos %u): ELEM %s", i + 1, item->pos, item->node->schema->name);
                }
                break;
            case LYXP_NODE_TEXT:
                if (item->node->schema->nodetype & LYS_ANYDATA) {
                    LOGDBG(LY_LDGXPATH, "\t%d (pos %u): TEXT <%s>", i + 1, item->pos,
                           item->node->schema->nodetype == LYS_ANYXML ? "anyxml" : "anydata");
                } else {
                    LOGDBG(LY_LDGXPATH, "\t%d (pos %u): TEXT %s", i + 1, item->pos,
                           ((struct lyd_node_leaf_list *)item->node)->value_str);
                }
                break;
            case LYXP_NODE_ATTR:
                LOGDBG(LY_LDGXPATH, "\t%d (pos %u): ATTR %s = %s", i + 1, item->pos, set->val.attrs[i].attr->name,
                       set->val.attrs[i].attr->value);
                break;
            }
        }
        break;

    case LYXP_SET_SNODE_SET:
        LOGDBG(LY_LDGXPATH, "set SNODE SET:");
        for (i = 0; i < set->used; ++i) {
            sitem = &set->val.snodes[i];

            switch (sitem->type) {
            case LYXP_NODE_ROOT:
                LOGDBG(LY_LDGXPATH, "\t%d (%u): ROOT", i + 1, sitem->in_ctx);
                break;
            case LYXP_NODE_ROOT_CONFIG:
                LOGDBG(LY_LDGXPATH, "\t%d (%u): ROOT CONFIG", i + 1, sitem->in_ctx);
                break;
            case LYXP_NODE_ELEM:
                LOGDBG(LY_LDGXPATH, "\t%d (%u): ELEM %s", i + 1, sitem->in_ctx, sitem->snode->name);
                break;
            default:
                LOGINT(NULL);
                break;
            }
        }
        break;

    case LYXP_SET_EMPTY:
        LOGDBG(LY_LDGXPATH, "set EMPTY");
        break;

    case LYXP_SET_BOOLEAN:
        LOGDBG(LY_LDGXPATH, "set BOOLEAN");
        LOGDBG(LY_LDGXPATH, "\t%s", (set->val.bool ? "true" : "false"));
        break;

    case LYXP_SET_STRING:
        LOGDBG(LY_LDGXPATH, "set STRING");
        LOGDBG(LY_LDGXPATH, "\t%s", set->val.str);
        break;

    case LYXP_SET_NUMBER:
        LOGDBG(LY_LDGXPATH, "set NUMBER");

        if (isnan(set->val.num)) {
            str_num = strdup("NaN");
        } else if ((set->val.num == 0) || (set->val.num == -0.0f)) {
            str_num = strdup("0");
        } else if (isinf(set->val.num) && !signbit(set->val.num)) {
            str_num = strdup("Infinity");
        } else if (isinf(set->val.num) && signbit(set->val.num)) {
            str_num = strdup("-Infinity");
        } else if ((long long)set->val.num == set->val.num) {
            if (asprintf(&str_num, "%lld", (long long)set->val.num) == -1) {
                str_num = NULL;
            }
        } else {
            if (asprintf(&str_num, "%03.1Lf", set->val.num) == -1) {
                str_num = NULL;
            }
        }
        LY_CHECK_ERR_RETURN(!str_num, LOGMEM(NULL), );

        LOGDBG(LY_LDGXPATH, "\t%s", str_num);
        free(str_num);
    }
}